

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

void ly_err_print_build_path(ly_ctx *ctx,lyd_node *node,lysc_node *scnode,ly_err_item *eitem)

{
  LY_VECODE local_3c;
  ly_err_item *eitem_local;
  lysc_node *scnode_local;
  lyd_node *node_local;
  ly_ctx *ctx_local;
  
  if (((eitem->data_path == (char *)0x0) && (eitem->schema_path == (char *)0x0)) &&
     (eitem->line == 0)) {
    if (node == (lyd_node *)0x0) {
      if (scnode != (lysc_node *)0x0) {
        ly_log_location(scnode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      }
    }
    else {
      ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
    }
    if (eitem->err == LY_EVALID) {
      local_3c = eitem->vecode;
    }
    else {
      local_3c = LYVE_DATA;
    }
    ly_vlog(ctx,eitem->apptag,local_3c,"%s",eitem->msg);
    if (node == (lyd_node *)0x0) {
      if (scnode != (lysc_node *)0x0) {
        ly_log_location_revert(1,0,0,0);
      }
    }
    else {
      ly_log_location_revert(0,1,0,0);
    }
  }
  else {
    ly_err_print(ctx,eitem);
  }
  return;
}

Assistant:

static void
ly_err_print_build_path(const struct ly_ctx *ctx, const struct lyd_node *node, const struct lysc_node *scnode,
        struct ly_err_item *eitem)
{
    if (eitem->data_path || eitem->schema_path || eitem->line) {
        ly_err_print(ctx, eitem);
    } else {
        if (node) {
            LOG_LOCSET(NULL, node);
        } else if (scnode) {
            LOG_LOCSET(scnode, NULL);
        }
        ly_vlog(ctx, eitem->apptag, eitem->err == LY_EVALID ? eitem->vecode : LYVE_DATA, "%s", eitem->msg);
        if (node) {
            LOG_LOCBACK(0, 1);
        } else if (scnode) {
            LOG_LOCBACK(1, 0);
        }
    }
}